

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_process.cc
# Opt level: O3

void flyd::flyd_master_process_cycle(void)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  __pid_t _Var4;
  LogStream *pLVar5;
  char **ppcVar6;
  uint uVar7;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  sigset_t set;
  sigset_t set_1;
  sigset_t local_1100;
  sigset_t local_1080;
  Logger local_1000;
  
  sigemptyset(&local_1100);
  sigaddset(&local_1100,0x11);
  sigaddset(&local_1100,0xe);
  sigaddset(&local_1100,0x1d);
  sigaddset(&local_1100,2);
  sigaddset(&local_1100,1);
  sigaddset(&local_1100,10);
  sigaddset(&local_1100,0xc);
  sigaddset(&local_1100,0x1c);
  sigaddset(&local_1100,0xf);
  sigaddset(&local_1100,3);
  iVar3 = sigprocmask(0,&local_1100,(sigset_t *)0x0);
  if (iVar3 == -1) {
    file._8_8_ = 0xf;
    file.data_ = "flyd_process.cc";
    muduo::Logger::Logger(&local_1000,file,0x75,ERROR);
    if (0x19 < (uint)(((int)&local_1000 + 0xfb8) - (int)local_1000.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(local_1000.impl_.stream_.buffer_.cur_,"信号屏蔽设置失败!",0x19);
      local_1000.impl_.stream_.buffer_.cur_ = local_1000.impl_.stream_.buffer_.cur_ + 0x19;
    }
    muduo::Logger::~Logger(&local_1000);
  }
  iVar3 = 4;
  do {
    _Var4 = fork();
    if (_Var4 == -1) {
      file_00._8_8_ = 0xf;
      file_00.data_ = "flyd_process.cc";
      muduo::Logger::Logger(&local_1000,file_00,0xa7,FATAL);
      if (0x43 < (uint)(((int)&local_1000 + 0xfb8) - (int)local_1000.impl_.stream_.buffer_.cur_)) {
        memcpy(local_1000.impl_.stream_.buffer_.cur_,anon_var_dwarf_193eb,0x43);
        local_1000.impl_.stream_.buffer_.cur_ = local_1000.impl_.stream_.buffer_.cur_ + 0x43;
      }
      muduo::Logger::~Logger(&local_1000);
    }
    else if (_Var4 == 0) {
      flyd_parent = getppid();
      flyd_pid = getpid();
      flyd_process = FLYD_WORK_PROCESS;
      prctl(0xf,"flyd_worker");
      sigemptyset(&local_1080);
      iVar3 = sigprocmask(2,&local_1080,(sigset_t *)0x0);
      if (iVar3 == -1) {
        file_02._8_8_ = 0xf;
        file_02.data_ = "flyd_process.cc";
        muduo::Logger::Logger(&local_1000,file_02,0xdb,ERROR);
        if (0x30 < (uint)(((int)&local_1000 + 0xfb8) - (int)local_1000.impl_.stream_.buffer_.cur_))
        {
          builtin_strncpy(local_1000.impl_.stream_.buffer_.cur_,
                          "ngx_worker_process_init()中sigprocmask()失败!",0x30);
          local_1000.impl_.stream_.buffer_.cur_ = local_1000.impl_.stream_.buffer_.cur_ + 0x30;
        }
        muduo::Logger::~Logger(&local_1000);
      }
      muduo::ThreadPool::start(&g_threadpool,5);
      bVar2 = CSocekt::Initialize_subproc(&g_socket.super_CSocekt);
      if (!bVar2) {
        file_03._8_8_ = 0xf;
        file_03.data_ = "flyd_process.cc";
        muduo::Logger::Logger(&local_1000,file_03,0xe3,FATAL);
        if (0x18 < (uint)(((int)&local_1000 + 0xfb8) - (int)local_1000.impl_.stream_.buffer_.cur_))
        {
          builtin_strncpy(local_1000.impl_.stream_.buffer_.cur_,"子进程初始化失败",0x18);
          local_1000.impl_.stream_.buffer_.cur_ = local_1000.impl_.stream_.buffer_.cur_ + 0x18;
        }
        muduo::Logger::~Logger(&local_1000);
      }
      CSocekt::flyd_epoll_init(&g_socket.super_CSocekt);
      if (muduo::g_logLevel < 3) {
        file_04._8_8_ = 0xf;
        file_04.data_ = "flyd_process.cc";
        muduo::Logger::Logger(&local_1000,file_04,0xc5);
        iVar3 = (int)&local_1000 + 0xfb8;
        uVar7 = iVar3 - (int)local_1000.impl_.stream_.buffer_.cur_;
        if (0x12 < uVar7) {
          builtin_strncpy(local_1000.impl_.stream_.buffer_.cur_,"【worker进程】",0x12);
          local_1000.impl_.stream_.buffer_.cur_ = local_1000.impl_.stream_.buffer_.cur_ + 0x12;
          uVar7 = iVar3 - (int)local_1000.impl_.stream_.buffer_.cur_;
        }
        if (0xb < uVar7) {
          builtin_strncpy(local_1000.impl_.stream_.buffer_.cur_,"flyd_worker",0xb);
          local_1000.impl_.stream_.buffer_.cur_ = local_1000.impl_.stream_.buffer_.cur_ + 0xb;
        }
        pLVar5 = muduo::LogStream::operator<<(&local_1000.impl_.stream_,flyd_pid);
        ppcVar6 = &(pLVar5->buffer_).cur_;
        pcVar1 = (pLVar5->buffer_).cur_;
        if (0x1c < (uint)((int)ppcVar6 - (int)pcVar1)) {
          builtin_strncpy(pcVar1,"启动并开始运行......!",0x1c);
          *ppcVar6 = *ppcVar6 + 0x1c;
        }
        muduo::Logger::~Logger(&local_1000);
      }
      dummyFlush();
      do {
        flyd_process_events_and_timers();
      } while( true );
    }
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  sigemptyset(&local_1100);
  iVar3 = sigprocmask(2,&local_1100,(sigset_t *)0x0);
  if (iVar3 == -1) {
    file_01._8_8_ = 0xf;
    file_01.data_ = "flyd_process.cc";
    muduo::Logger::Logger(&local_1000,file_01,0x82,ERROR);
    if (0x19 < (uint)(((int)&local_1000 + 0xfb8) - (int)local_1000.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(local_1000.impl_.stream_.buffer_.cur_,"清空信号屏蔽失败!",0x19);
      local_1000.impl_.stream_.buffer_.cur_ = local_1000.impl_.stream_.buffer_.cur_ + 0x19;
    }
    muduo::Logger::~Logger(&local_1000);
  }
  dummyFlush();
  do {
    sleep(1);
  } while( true );
}

Assistant:

void flyd_master_process_cycle() {
        sigset_t set;        //信号集

        sigemptyset(&set);   //清空信号集

        //下列这些信号在执行本函数期间不希望收到【考虑到官方nginx中有这些信号，老师就都搬过来了】（保护不希望由信号中断的代码临界区）
        //建议fork()子进程时学习这种写法，防止信号的干扰；
        sigaddset(&set, SIGCHLD);     //子进程状态改变
        sigaddset(&set, SIGALRM);     //定时器超时
        sigaddset(&set, SIGIO);       //异步I/O
        sigaddset(&set, SIGINT);      //终端中断符
        sigaddset(&set, SIGHUP);      //连接断开
        sigaddset(&set, SIGUSR1);     //用户定义信号
        sigaddset(&set, SIGUSR2);     //用户定义信号
        sigaddset(&set, SIGWINCH);    //终端窗口大小改变
        sigaddset(&set, SIGTERM);     //终止
        sigaddset(&set, SIGQUIT);     //终端退出符
        //.........可以根据开发的实际需要往其中添加其他要屏蔽的信号......

        //设置，此时无法接受的信号；阻塞期间，你发过来的上述信号，多个会被合并为一个，暂存着，等你放开信号屏蔽后才能收到这些信号。。。
        //sigprocmask()在第三章第五节详细讲解过 ， 设置信号屏蔽
        if (sigprocmask(SIG_BLOCK, &set, NULL) == -1) //第一个参数用了SIG_BLOCK表明设置 进程 新的信号屏蔽字 为 “当前信号屏蔽字 和 第二个参数指向的信号集的并集
        {
            LOG_ERROR << "信号屏蔽设置失败!";
        }
        //即便sigprocmask失败，程序流程 也继续往下走

        //从配置文件中读取要创建的worker进程数量
//    CConfig *p_config = CConfig::GetInstance(); //单例类
//    int workprocess = p_config->GetIntDefault("WorkerProcesses",1); //从配置文件中得到要创建的worker进程数量
        flyd_start_worker_processes(4);  //这里要创建worker子进程

        //清空信号屏蔽
        sigemptyset(&set); //信号屏蔽字为空，表示不屏蔽任何信号
        if (sigprocmask(SIG_SETMASK, &set, NULL) == -1) //第一个参数用了SIG_BLOCK表明设置 进程 新的信号屏蔽字 为 “当前信号屏蔽字 和 第二个参数指向的信号集的并集
        {
            LOG_ERROR << "清空信号屏蔽失败!";
        }

        dummyFlush();//进入主循环前将日志消息写入文件
        while(1) {

            //    usleep(100000);
            //ngx_log_error_core(0,0,"haha--这是父进程，pid为%P",ngx_pid);

           // sigsuspend(&set); //阻塞在这里，等待一个信号，此时进程是挂起的，不占用cpu时间，只有收到信号才会被唤醒（返回）；

            sleep(1); //休息1秒
            //以后扩充.......

        }// end for(;;)

    }